

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::append(QString *this,QChar ch)

{
  long lVar1;
  DataOps *pDVar2;
  char16_t *pcVar3;
  undefined2 in_SI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffffd0;
  qsizetype n;
  undefined6 in_stack_fffffffffffffff0;
  parameter_type t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n = 1;
  QArrayDataPointer<char16_t>::detachAndGrow
            ((QArrayDataPointer<char16_t> *)CONCAT26(in_SI,in_stack_fffffffffffffff0),
             (GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_RDI,(char16_t **)0x1,
             in_stack_ffffffffffffffd0);
  pDVar2 = QArrayDataPointer<char16_t>::operator->(in_RDI);
  t = (parameter_type)((ulong)pDVar2 >> 0x30);
  QChar::unicode((QChar *)&stack0xfffffffffffffff6);
  QtPrivate::QPodArrayOps<char16_t>::copyAppend((QPodArrayOps<char16_t> *)in_RDI,n,t);
  pcVar3 = QArrayDataPointer<char16_t>::data(in_RDI);
  pcVar3[in_RDI->size] = L'\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::append(QChar ch)
{
    d.detachAndGrow(QArrayData::GrowsAtEnd, 1, nullptr, nullptr);
    d->copyAppend(1, ch.unicode());
    d.data()[d.size] = '\0';
    return *this;
}